

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_txn_state(sqlite3 *db,char *zSchema)

{
  long lVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (zSchema == (char *)0x0) {
    iVar4 = db->nDb + -1;
    lVar3 = 0;
  }
  else {
    iVar2 = sqlite3FindDbName(db,zSchema);
    iVar4 = (iVar2 >> 0x1f) + iVar2;
    lVar3 = (long)iVar2;
  }
  uVar5 = lVar3 << 5 | 8;
  uVar6 = 0xffffffff;
  for (; lVar3 <= iVar4; lVar3 = lVar3 + 1) {
    lVar1 = *(long *)((long)&db->aDb->zDbSName + uVar5);
    if (lVar1 == 0) {
      uVar7 = 0;
    }
    else {
      uVar7 = (uint)*(byte *)(lVar1 + 0x10);
    }
    if ((int)uVar6 < (int)uVar7) {
      uVar6 = uVar7;
    }
    uVar5 = uVar5 + 0x20;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return uVar6;
}

Assistant:

SQLITE_API int sqlite3_txn_state(sqlite3 *db, const char *zSchema){
  int iDb, nDb;
  int iTxn = -1;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return -1;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  if( zSchema ){
    nDb = iDb = sqlite3FindDbName(db, zSchema);
    if( iDb<0 ) nDb--;
  }else{
    iDb = 0;
    nDb = db->nDb-1;
  }
  for(; iDb<=nDb; iDb++){
    Btree *pBt = db->aDb[iDb].pBt;
    int x = pBt!=0 ? sqlite3BtreeTxnState(pBt) : SQLITE_TXN_NONE;
    if( x>iTxn ) iTxn = x;
  }
  sqlite3_mutex_leave(db->mutex);
  return iTxn;
}